

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O3

PICK_MODE_CONTEXT *
av1_alloc_pmc(AV1_COMP *cpi,BLOCK_SIZE bsize,PC_TREE_SHARED_BUFFERS *shared_bufs)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  PICK_MODE_CONTEXT *pPVar4;
  uint8_t *puVar5;
  ulong uVar6;
  uint16_t *puVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong num;
  bool bVar11;
  PICK_MODE_CONTEXT *ctx;
  aom_internal_error_info error;
  aom_internal_error_info local_1d0;
  
  iVar3 = _setjmp((__jmp_buf_tag *)local_1d0.jmp);
  if (iVar3 == 0) {
    local_1d0.setjmp = 1;
    pPVar4 = (PICK_MODE_CONTEXT *)aom_calloc(1,0x1d8);
    if (pPVar4 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,"Failed to allocate ctx");
    }
    pPVar4->rd_mode_is_ready = 0;
    uVar1 = ((cpi->common).seq_params)->monochrome;
    uVar8 = (uint)block_size_high[bsize] * (uint)block_size_wide[bsize];
    uVar9 = uVar8 >> 4;
    num = (ulong)uVar9;
    puVar5 = (uint8_t *)aom_calloc(num,1);
    pPVar4->blk_skip = puVar5;
    if (pPVar4->blk_skip == (uint8_t *)0x0) {
      aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,"Failed to allocate ctx->blk_skip");
    }
    puVar5 = (uint8_t *)aom_calloc(num,1);
    pPVar4->tx_type_map = puVar5;
    if (pPVar4->tx_type_map == (uint8_t *)0x0) {
      aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,"Failed to allocate ctx->tx_type_map");
    }
    pPVar4->num_4x4_blk = uVar9;
    uVar6 = 0;
    do {
      pPVar4->coeff[uVar6] = shared_bufs->coeff_buf[uVar6];
      pPVar4->qcoeff[uVar6] = shared_bufs->qcoeff_buf[uVar6];
      pPVar4->dqcoeff[uVar6] = shared_bufs->dqcoeff_buf[uVar6];
      puVar7 = (uint16_t *)aom_memalign(0x20,(ulong)(uVar9 * 2));
      pPVar4->eobs[uVar6] = puVar7;
      if (pPVar4->eobs[uVar6] == (uint16_t *)0x0) {
        aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,"Failed to allocate ctx->eobs[i]");
      }
      puVar5 = (uint8_t *)aom_memalign(0x20,num);
      pPVar4->txb_entropy_ctx[uVar6] = puVar5;
      if (pPVar4->txb_entropy_ctx[uVar6] == (uint8_t *)0x0) {
        aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate ctx->txb_entropy_ctx[i]");
      }
    } while ((uVar1 == '\0') && (bVar11 = uVar6 < 2, uVar6 = uVar6 + 1, bVar11));
    if (uVar8 < 0x1001) {
      lVar10 = 0;
      bVar11 = true;
      do {
        bVar2 = bVar11;
        if ((cpi->common).features.allow_screen_content_tools == true) {
          puVar5 = (uint8_t *)aom_memalign(0x20,(ulong)uVar8);
          pPVar4->color_index_map[lVar10] = puVar5;
          if (pPVar4->color_index_map[lVar10] == (uint8_t *)0x0) {
            aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate ctx->color_index_map[i]");
          }
        }
        else {
          pPVar4->color_index_map[lVar10] = (uint8_t *)0x0;
        }
        lVar10 = 1;
        bVar11 = false;
      } while (bVar2);
    }
    (pPVar4->rd_stats).rate = 0x7fffffff;
    (pPVar4->rd_stats).zero_rate = 0;
    (pPVar4->rd_stats).dist = 0x7fffffffffffffff;
    (pPVar4->rd_stats).rdcost = 0x7fffffffffffffff;
    (pPVar4->rd_stats).sse = 0x7fffffffffffffff;
    (pPVar4->rd_stats).skip_txfm = '\0';
  }
  else {
    av1_free_pmc((PICK_MODE_CONTEXT *)0x0,
                 (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
    pPVar4 = (PICK_MODE_CONTEXT *)0x0;
  }
  return pPVar4;
}

Assistant:

PICK_MODE_CONTEXT *av1_alloc_pmc(const struct AV1_COMP *const cpi,
                                 BLOCK_SIZE bsize,
                                 PC_TREE_SHARED_BUFFERS *shared_bufs) {
  PICK_MODE_CONTEXT *volatile ctx = NULL;
  const AV1_COMMON *const cm = &cpi->common;
  struct aom_internal_error_info error;

  if (setjmp(error.jmp)) {
    av1_free_pmc(ctx, av1_num_planes(cm));
    return NULL;
  }
  error.setjmp = 1;

  AOM_CHECK_MEM_ERROR(&error, ctx, aom_calloc(1, sizeof(*ctx)));
  ctx->rd_mode_is_ready = 0;

  const int num_planes = av1_num_planes(cm);
  const int num_pix = block_size_wide[bsize] * block_size_high[bsize];
  const int num_blk = num_pix / 16;

  AOM_CHECK_MEM_ERROR(&error, ctx->blk_skip,
                      aom_calloc(num_blk, sizeof(*ctx->blk_skip)));
  AOM_CHECK_MEM_ERROR(&error, ctx->tx_type_map,
                      aom_calloc(num_blk, sizeof(*ctx->tx_type_map)));
  ctx->num_4x4_blk = num_blk;

  for (int i = 0; i < num_planes; ++i) {
    ctx->coeff[i] = shared_bufs->coeff_buf[i];
    ctx->qcoeff[i] = shared_bufs->qcoeff_buf[i];
    ctx->dqcoeff[i] = shared_bufs->dqcoeff_buf[i];
    AOM_CHECK_MEM_ERROR(&error, ctx->eobs[i],
                        aom_memalign(32, num_blk * sizeof(*ctx->eobs[i])));
    AOM_CHECK_MEM_ERROR(
        &error, ctx->txb_entropy_ctx[i],
        aom_memalign(32, num_blk * sizeof(*ctx->txb_entropy_ctx[i])));
  }

  if (num_pix <= MAX_PALETTE_SQUARE) {
    for (int i = 0; i < 2; ++i) {
      if (cm->features.allow_screen_content_tools) {
        AOM_CHECK_MEM_ERROR(
            &error, ctx->color_index_map[i],
            aom_memalign(32, num_pix * sizeof(*ctx->color_index_map[i])));
      } else {
        ctx->color_index_map[i] = NULL;
      }
    }
  }

  av1_invalid_rd_stats(&ctx->rd_stats);

  return ctx;
}